

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O1

SourceResultType __thiscall
duckdb::PhysicalAsOfJoin::GetData
          (PhysicalAsOfJoin *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  __pthread_list_t *p_Var1;
  __pthread_internal_list **pp_Var2;
  unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true> *this_00;
  vector<duckdb::InterruptState,_true> *pvVar3;
  AsOfProbeBuffer *this_01;
  pointer pIVar4;
  GlobalSourceState *pGVar5;
  AsOfLocalSourceState *this_02;
  _func_int **pp_Var6;
  ClientContext *context_00;
  _func_int *p_Var7;
  _func_int *p_Var8;
  pointer pIVar9;
  _Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_> __ptr;
  _Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  __ptr_00;
  idx_t iVar10;
  bool *pbVar11;
  pointer pLVar12;
  pointer pLVar13;
  bool bVar14;
  int iVar15;
  type pPVar16;
  pointer this_03;
  unsafe_vector<unique_ptr<TupleDataCollection>_> *puVar17;
  Allocator *allocator;
  HashGroupPtr *this_04;
  pointer pPVar18;
  pointer pRVar19;
  reference pvVar20;
  const_reference pvVar21;
  reference pvVar22;
  const_reference pvVar23;
  reference other;
  idx_t iVar24;
  ExecutionContext *pEVar25;
  pointer __n;
  ExecutionContext *context_01;
  long lVar26;
  size_type sVar27;
  size_type __n_00;
  SelectionVector rsel;
  DataChunk rhs_chunk;
  idx_t local_c8;
  SelectionVector local_88;
  DataChunk local_70;
  
  pGVar5 = input->global_state;
  this_02 = (AsOfLocalSourceState *)input->local_state;
  pp_Var6 = pGVar5[1]._vptr_GlobalSourceState;
  context_00 = context->client;
  context_01 = context;
  bVar14 = AsOfLocalSourceState::CombineLeftPartitions(this_02);
  if ((bVar14) && (bVar14 = AsOfLocalSourceState::MergeLeftPartitions(this_02), bVar14)) {
    pPVar16 = unique_ptr<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>,_true>
              ::operator*((unique_ptr<duckdb::PartitionGlobalSinkState,_std::default_delete<duckdb::PartitionGlobalSinkState>,_true>
                           *)(pGVar5[1]._vptr_GlobalSourceState + 0x32));
    if ((pPVar16->grouping_data).
        super_unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::RadixPartitionedTupleData_*,_std::default_delete<duckdb::RadixPartitionedTupleData>_>
        .super__Head_base<0UL,_duckdb::RadixPartitionedTupleData_*,_false>._M_head_impl ==
        (RadixPartitionedTupleData *)0x0) {
      pEVar25 = (ExecutionContext *)&DAT_00000001;
    }
    else {
      this_03 = unique_ptr<duckdb::RadixPartitionedTupleData,_std::default_delete<duckdb::RadixPartitionedTupleData>,_true>
                ::operator->(&pPVar16->grouping_data);
      puVar17 = PartitionedTupleData::GetPartitions(&this_03->super_PartitionedTupleData);
      pEVar25 = (ExecutionContext *)
                ((long)(puVar17->
                       super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(puVar17->
                       super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                       ).
                       super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3);
    }
    if ((ExecutionContext *)
        pGVar5[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.
        __next < pEVar25) {
      this_01 = &this_02->probe_buffer;
      do {
        if ((this_02->probe_buffer).lhs_scanner.
            super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>.
            _M_t.
            super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
            .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl ==
            (PayloadScanner *)0x0) {
          LOCK();
          p_Var1 = &pGVar5[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
                    __list;
          context_01 = (ExecutionContext *)p_Var1->__prev;
          p_Var1->__prev = (__pthread_internal_list *)((long)&p_Var1->__prev->__prev + 1);
          UNLOCK();
          if (context_01 < pEVar25) {
            AsOfProbeBuffer::BeginLeftScan(this_01,(hash_t)context_01);
            iVar15 = 0;
          }
          else {
            bVar14 = IsRightOuterJoin((this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                                      super_CachingPhysicalOperator.field_0x81);
            iVar15 = 1;
            if ((bVar14) && (((context_00->interrupted)._M_base._M_i & 1U) == 0)) {
              TaskScheduler::GetScheduler(context_00);
              TaskScheduler::YieldThread();
              iVar15 = 2;
            }
          }
          if (iVar15 == 0) goto LAB_0155d28a;
          if (iVar15 != 2) {
            return true;
          }
        }
        else {
LAB_0155d28a:
          AsOfProbeBuffer::GetData(this_01,context_01,chunk);
          if (chunk->count != 0) {
            return false;
          }
          bVar14 = AsOfProbeBuffer::HasMoreData(this_01);
          if (!bVar14) {
            AsOfProbeBuffer::EndLeftScan(this_01);
            LOCK();
            pp_Var2 = &pGVar5[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
                       __data.__list.__next;
            *pp_Var2 = (__pthread_internal_list *)((long)&(*pp_Var2)->__prev + 1);
            UNLOCK();
          }
        }
      } while ((ExecutionContext *)
               pGVar5[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.
               __list.__next < pEVar25);
    }
    bVar14 = IsRightOuterJoin((this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                              super_CachingPhysicalOperator.field_0x81);
    if (bVar14) {
      p_Var7 = pp_Var6[0x22];
      p_Var8 = pp_Var6[0x21];
      DataChunk::DataChunk(&local_70);
      allocator = Allocator::Get(context->client);
      DataChunk::Initialize
                (&local_70,allocator,(vector<duckdb::LogicalType,_true> *)(pp_Var6 + 0x1e),0x800);
      SelectionVector::SelectionVector(&local_88,0x800);
      pIVar9 = (pointer)((long)p_Var7 - (long)p_Var8 >> 3);
      this_00 = &this_02->scanner;
      this_04 = &this_02->hash_group;
LAB_0155d383:
      if (chunk->count == 0) {
        do {
          if (((PayloadScanner *)
              (this_00->
              super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
              )._M_t.
              super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
              .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>)._M_head_impl !=
              (PayloadScanner *)0x0) {
            pPVar18 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>
                      ::operator->(this_00);
            pRVar19 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
                      ::operator->(&pPVar18->scanner);
            if (pRVar19->total_count != pRVar19->total_scanned) goto LAB_0155d47d;
          }
          __ptr.super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl =
               (this_00->
               super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
               .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>;
          (this_00->
          super_unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::PayloadScanner_*,_std::default_delete<duckdb::PayloadScanner>_>
          .super__Head_base<0UL,_duckdb::PayloadScanner_*,_false> =
               (_Head_base<0UL,_duckdb::PayloadScanner_*,_false>)0x0;
          if (__ptr.super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl !=
              (PayloadScanner *)0x0) {
            ::std::default_delete<duckdb::PayloadScanner>::operator()
                      ((default_delete<duckdb::PayloadScanner> *)this_00,
                       (PayloadScanner *)
                       __ptr.super__Head_base<0UL,_duckdb::PayloadScanner_*,_false>._M_head_impl);
          }
          __ptr_00.super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl =
               (this_04->
               super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
               )._M_t.
               super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
               .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>;
          (this_04->
          super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
          .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false> =
               (_Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>)0x0;
          if (__ptr_00.super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl
              != (PartitionGlobalHashGroup *)0x0) {
            ::std::default_delete<duckdb::PartitionGlobalHashGroup>::operator()
                      ((default_delete<duckdb::PartitionGlobalHashGroup> *)this_04,
                       (PartitionGlobalHashGroup *)
                       __ptr_00.super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>.
                       _M_head_impl);
          }
          LOCK();
          pvVar3 = &pGVar5[1].super_StateWithBlockableTasks.blocked_tasks;
          pIVar4 = (pvVar3->
                   super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>).
                   super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          (pvVar3->super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>).
          super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)&((pvVar3->
                          super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                          ).
                          super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                          ._M_impl.super__Vector_impl_data._M_start)->field_0x1;
          UNLOCK();
          bVar14 = true;
          if (pIVar9 <= pIVar4) goto LAB_0155d63b;
          __n = pIVar4;
          if (pIVar4 < (pointer)((long)pp_Var6[0x22] - (long)pp_Var6[0x21] >> 3)) {
            do {
              pvVar20 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                        ::operator[]((vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
                                      *)(pp_Var6 + 0x21),(size_type)__n);
              if ((pvVar20->
                  super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
                  )._M_t.
                  super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
                  .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl !=
                  (PartitionGlobalHashGroup *)0x0) break;
              LOCK();
              pvVar3 = &pGVar5[1].super_StateWithBlockableTasks.blocked_tasks;
              __n = (pvVar3->
                    super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>).
                    super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                    ._M_impl.super__Vector_impl_data._M_start;
              (pvVar3->super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
              ).super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   (pointer)&((pvVar3->
                              super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                              ).
                              super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>
                              ._M_impl.super__Vector_impl_data._M_start)->field_0x1;
              UNLOCK();
            } while (__n < (pointer)((long)pp_Var6[0x22] - (long)pp_Var6[0x21] >> 3));
          }
          AsOfLocalSourceState::BeginRightScan(this_02,(idx_t)__n);
          if (pIVar9 <= pIVar4) goto LAB_0155d63b;
        } while( true );
      }
      goto LAB_0155d62e;
    }
  }
  return true;
LAB_0155d47d:
  pPVar18 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
            operator->(this_00);
  pRVar19 = unique_ptr<duckdb::RowDataCollectionScanner,_std::default_delete<duckdb::RowDataCollectionScanner>,_true>
            ::operator->(&pPVar18->scanner);
  iVar10 = pRVar19->total_scanned;
  pPVar18 = unique_ptr<duckdb::PayloadScanner,_std::default_delete<duckdb::PayloadScanner>,_true>::
            operator->(this_00);
  PayloadScanner::Scan(pPVar18,&local_70);
  if (local_70.count == 0) {
    iVar15 = 1;
  }
  else {
    pbVar11 = this_02->found_match;
    iVar24 = 0;
    local_c8 = 0;
    do {
      if (pbVar11[iVar24 + iVar10] == false) {
        local_88.sel_vector[local_c8] = (sel_t)iVar24;
        local_c8 = local_c8 + 1;
      }
      iVar24 = iVar24 + 1;
    } while (local_70.count != iVar24);
    if (local_c8 == 0) {
      iVar15 = 0;
    }
    else {
      pvVar21 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                          (&(this->super_PhysicalComparisonJoin).super_PhysicalJoin.
                            super_CachingPhysicalOperator.super_PhysicalOperator.children,0);
      pLVar12 = (pvVar21->_M_data->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      pLVar13 = (pvVar21->_M_data->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar26 = ((long)pLVar12 - (long)pLVar13 >> 3) * -0x5555555555555555;
      if (pLVar12 != pLVar13) {
        sVar27 = 0;
        do {
          pvVar22 = vector<duckdb::Vector,_true>::operator[](&chunk->data,sVar27);
          Vector::SetVectorType(pvVar22,CONSTANT_VECTOR);
          pvVar22 = vector<duckdb::Vector,_true>::operator[](&chunk->data,sVar27);
          ConstantVector::SetNull(pvVar22,true);
          sVar27 = sVar27 + 1;
        } while (lVar26 + (ulong)(lVar26 == 0) != sVar27);
      }
      if ((this->right_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (this->right_projection_map).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) {
        __n_00 = 0;
        do {
          pvVar23 = vector<unsigned_long,_true>::operator[](&this->right_projection_map,__n_00);
          sVar27 = *pvVar23;
          pvVar22 = vector<duckdb::Vector,_true>::operator[](&chunk->data,lVar26 + __n_00);
          other = vector<duckdb::Vector,_true>::operator[](&local_70.data,sVar27);
          Vector::Slice(pvVar22,other,&local_88,local_c8);
          __n_00 = __n_00 + 1;
        } while (__n_00 < (ulong)((long)(this->right_projection_map).
                                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->right_projection_map).
                                        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      chunk->count = local_c8;
      iVar15 = 5;
    }
  }
  if (iVar15 != 0) {
    if (iVar15 == 5) {
LAB_0155d62e:
      bVar14 = chunk->count == 0;
    }
    else {
      bVar14 = true;
    }
LAB_0155d63b:
    if (local_88.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    DataChunk::~DataChunk(&local_70);
    return bVar14;
  }
  goto LAB_0155d383;
}

Assistant:

SourceResultType PhysicalAsOfJoin::GetData(ExecutionContext &context, DataChunk &chunk,
                                           OperatorSourceInput &input) const {
	auto &gsource = input.global_state.Cast<AsOfGlobalSourceState>();
	auto &lsource = input.local_state.Cast<AsOfLocalSourceState>();
	auto &rhs_sink = gsource.gsink.rhs_sink;
	auto &client = context.client;

	//	Step 1: Combine the partitions
	if (!lsource.CombineLeftPartitions()) {
		return SourceResultType::FINISHED;
	}

	//	Step 2: Sort on all threads
	if (!lsource.MergeLeftPartitions()) {
		return SourceResultType::FINISHED;
	}

	//	Step 3: Join the partitions
	auto &lhs_sink = *gsource.gsink.lhs_sink;
	const auto left_bins = lhs_sink.grouping_data ? lhs_sink.grouping_data->GetPartitions().size() : 1;
	while (gsource.flushed < left_bins) {
		//	Make sure we have something to flush
		if (!lsource.probe_buffer.Scanning()) {
			const auto left_bin = gsource.next_left++;
			if (left_bin < left_bins) {
				//	More to flush
				lsource.probe_buffer.BeginLeftScan(left_bin);
			} else if (!IsRightOuterJoin(join_type) || client.interrupted) {
				return SourceResultType::FINISHED;
			} else {
				//	Wait for all threads to finish
				//	TODO: How to implement a spin wait correctly?
				//	Returning BLOCKED seems to hang the system.
				TaskScheduler::GetScheduler(client).YieldThread();
				continue;
			}
		}

		lsource.probe_buffer.GetData(context, chunk);
		if (chunk.size()) {
			return SourceResultType::HAVE_MORE_OUTPUT;
		} else if (lsource.probe_buffer.HasMoreData()) {
			//	Join the next partition
			continue;
		} else {
			lsource.probe_buffer.EndLeftScan();
			gsource.flushed++;
		}
	}

	//	Step 4: Emit right join matches
	if (!IsRightOuterJoin(join_type)) {
		return SourceResultType::FINISHED;
	}

	auto &hash_groups = rhs_sink.hash_groups;
	const auto right_groups = hash_groups.size();

	DataChunk rhs_chunk;
	rhs_chunk.Initialize(Allocator::Get(context.client), rhs_sink.payload_types);
	SelectionVector rsel(STANDARD_VECTOR_SIZE);

	while (chunk.size() == 0) {
		//	Move to the next bin if we are done.
		while (!lsource.scanner || !lsource.scanner->Remaining()) {
			lsource.scanner.reset();
			lsource.hash_group.reset();
			auto hash_bin = gsource.next_right++;
			if (hash_bin >= right_groups) {
				return SourceResultType::FINISHED;
			}

			for (; hash_bin < hash_groups.size(); hash_bin = gsource.next_right++) {
				if (hash_groups[hash_bin]) {
					break;
				}
			}
			lsource.BeginRightScan(hash_bin);
		}
		const auto rhs_position = lsource.scanner->Scanned();
		lsource.scanner->Scan(rhs_chunk);

		const auto count = rhs_chunk.size();
		if (count == 0) {
			return SourceResultType::FINISHED;
		}

		// figure out which tuples didn't find a match in the RHS
		auto found_match = lsource.found_match;
		idx_t result_count = 0;
		for (idx_t i = 0; i < count; i++) {
			if (!found_match[rhs_position + i]) {
				rsel.set_index(result_count++, i);
			}
		}

		if (result_count > 0) {
			// if there were any tuples that didn't find a match, output them
			const idx_t left_column_count = children[0].get().GetTypes().size();
			for (idx_t col_idx = 0; col_idx < left_column_count; ++col_idx) {
				chunk.data[col_idx].SetVectorType(VectorType::CONSTANT_VECTOR);
				ConstantVector::SetNull(chunk.data[col_idx], true);
			}
			for (idx_t col_idx = 0; col_idx < right_projection_map.size(); ++col_idx) {
				const auto rhs_idx = right_projection_map[col_idx];
				chunk.data[left_column_count + col_idx].Slice(rhs_chunk.data[rhs_idx], rsel, result_count);
			}
			chunk.SetCardinality(result_count);
			break;
		}
	}

	return chunk.size() > 0 ? SourceResultType::HAVE_MORE_OUTPUT : SourceResultType::FINISHED;
}